

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O0

void * Js::JavascriptNativeOperators::Op_SwitchStringLookUp
                 (JavascriptString *str,
                 BranchDictionaryWrapper<Js::JavascriptString_*> *branchTargets,uintptr_t funcStart,
                 uintptr_t funcEnd)

{
  void *pvVar1;
  code *pcVar2;
  bool bVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  uintptr_t utarget;
  void *target;
  BranchDictionary *stringDictionary;
  void *defaultTarget;
  uintptr_t funcEnd_local;
  uintptr_t funcStart_local;
  BranchDictionaryWrapper<Js::JavascriptString_*> *branchTargets_local;
  JavascriptString *str_local;
  
  stringDictionary = *(BranchDictionary **)(branchTargets + 0x38);
  defaultTarget = (void *)funcEnd;
  funcEnd_local = funcStart;
  funcStart_local = (uintptr_t)branchTargets;
  branchTargets_local = (BranchDictionaryWrapper<Js::JavascriptString_*> *)str;
  ppvVar4 = JsUtil::
            BaseDictionary<Js::JavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
            ::Lookup((BaseDictionary<Js::JavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<Js::JavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
                      *)branchTargets,(JavascriptString **)&branchTargets_local,&stringDictionary);
  pvVar1 = *ppvVar4;
  if ((long)defaultTarget - funcEnd_local < (long)pvVar1 - funcEnd_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JavascriptNativeOperators.cpp"
                                ,0x12,"((utarget - funcStart) <= (funcEnd - funcStart))",
                                "Switch string dictionary jump target outside of function");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return pvVar1;
}

Assistant:

void * JavascriptNativeOperators::Op_SwitchStringLookUp(JavascriptString* str, Js::BranchDictionaryWrapper<JavascriptString*>* branchTargets, uintptr_t funcStart, uintptr_t funcEnd)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(Op_SwitchStringLookUp);
        void* defaultTarget = branchTargets->defaultTarget;
        Js::BranchDictionaryWrapper<JavascriptString*>::BranchDictionary& stringDictionary = branchTargets->dictionary;
        void* target = stringDictionary.Lookup(str, defaultTarget);
        uintptr_t utarget = (uintptr_t)target;

        AssertOrFailFastMsg((utarget - funcStart) <= (funcEnd - funcStart), "Switch string dictionary jump target outside of function");
        return target;
        JIT_HELPER_END(Op_SwitchStringLookUp);
    }